

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O0

void anon_unknown.dwarf_515e::show(fp_t d)

{
  basic_ostream<char,_std::char_traits<char>_> *this;
  unsigned_long_long in_XMM0_Qa;
  bitset<64UL> *unaff_retaddr;
  uint_t u;
  bitset<64UL> *in_stack_00000048;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_00000050;
  
  printf("%.18f\t",in_XMM0_Qa);
  printf("0x%016lx\t",in_XMM0_Qa);
  std::bitset<64UL>::bitset(unaff_retaddr,in_XMM0_Qa);
  this = std::operator<<(in_stack_00000050,in_stack_00000048);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void show(fp_t d)
{
    #ifdef FLEXFLOAT_ON_QUAD
    char buffer[128];
    quadmath_snprintf(buffer, sizeof buffer, "%.38Qf", d);
    printf("%s\t", buffer);
    #else
    printf(PRINTF_FORMAT "\t", d);
    #endif
    uint_t u = *((uint_t *) &d);
    #ifdef FLEXFLOAT_ON_SINGLE
    printf("0x%016x\t", u);
    #endif
    #ifdef FLEXFLOAT_ON_DOUBLE
    printf("0x%016lx\t", u);
    #endif
    std::cout << std::bitset<NUM_BITS>(u) << std::endl;
}